

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry_link_resolver.c
# Opt level: O2

links_entry_conflict * insert_entry(archive_entry_linkresolver *res,archive_entry *entry)

{
  size_t __nmemb;
  size_t sVar1;
  links_entry_conflict *plVar2;
  uint uVar3;
  links_entry_conflict *plVar4;
  archive_entry *paVar5;
  links_entry_conflict **pplVar6;
  dev_t dVar7;
  ulong uVar8;
  size_t sVar9;
  ulong uVar10;
  links_entry_conflict *plVar11;
  size_t new_size;
  
  plVar4 = (links_entry_conflict *)calloc(1,0x30);
  if (plVar4 != (links_entry_conflict *)0x0) {
    paVar5 = archive_entry_clone(entry);
    plVar4->canonical = paVar5;
    sVar1 = res->number_buckets;
    if ((-1 < (long)sVar1) && (__nmemb = sVar1 * 2, __nmemb < res->number_entries)) {
      pplVar6 = (links_entry_conflict **)calloc(__nmemb,8);
      if (pplVar6 != (links_entry_conflict **)0x0) {
        for (sVar9 = 0; sVar9 != sVar1; sVar9 = sVar9 + 1) {
          while( true ) {
            plVar11 = res->buckets[sVar9];
            if (plVar11 == (links_entry_conflict *)0x0) break;
            res->buckets[sVar9] = plVar11->next;
            uVar8 = plVar11->hash & __nmemb - 1;
            plVar2 = pplVar6[uVar8];
            if (plVar2 != (links_entry_conflict *)0x0) {
              plVar2->previous = plVar11;
            }
            plVar11->next = plVar2;
            plVar11->previous = (links_entry_conflict *)0x0;
            pplVar6[uVar8] = plVar11;
          }
        }
        free(res->buckets);
        res->buckets = pplVar6;
        res->number_buckets = __nmemb;
      }
    }
    dVar7 = archive_entry_dev(entry);
    uVar8 = archive_entry_ino64(entry);
    pplVar6 = res->buckets;
    uVar10 = res->number_buckets - 1 & (uVar8 ^ dVar7);
    if (pplVar6[uVar10] == (links_entry_conflict *)0x0) {
      plVar11 = (links_entry_conflict *)0x0;
    }
    else {
      pplVar6[uVar10]->previous = plVar4;
      plVar11 = pplVar6[uVar10];
    }
    res->number_entries = res->number_entries + 1;
    plVar4->next = plVar11;
    pplVar6[uVar10] = plVar4;
    plVar4->hash = uVar8 ^ dVar7;
    uVar3 = archive_entry_nlink(entry);
    plVar4->links = uVar3 - 1;
  }
  return plVar4;
}

Assistant:

static struct links_entry *
insert_entry(struct archive_entry_linkresolver *res,
    struct archive_entry *entry)
{
	struct links_entry *le;
	size_t hash, bucket;

	/* Add this entry to the links cache. */
	le = calloc(1, sizeof(struct links_entry));
	if (le == NULL)
		return (NULL);
	le->canonical = archive_entry_clone(entry);

	/* If the links cache is getting too full, enlarge the hash table. */
	if (res->number_entries > res->number_buckets * 2)
		grow_hash(res);

	hash = (size_t)(archive_entry_dev(entry) ^ archive_entry_ino64(entry));
	bucket = hash & (res->number_buckets - 1);

	/* If we could allocate the entry, record it. */
	if (res->buckets[bucket] != NULL)
		res->buckets[bucket]->previous = le;
	res->number_entries++;
	le->next = res->buckets[bucket];
	le->previous = NULL;
	res->buckets[bucket] = le;
	le->hash = hash;
	le->links = archive_entry_nlink(entry) - 1;
	return (le);
}